

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O3

int evfilt_write_knote_enable(filter *filt,knote *kn)

{
  int iVar1;
  uint32_t local_14;
  epoll_udata *local_10;
  
  if ((kn->kn_flags & 1) == 0) {
    iVar1 = epoll_update(1,filt,kn,kn->epoll_events,false);
    return iVar1;
  }
  local_14 = kn->epoll_events;
  local_10 = &kn->kn_udata;
  iVar1 = epoll_ctl(kn->kn_epollfd,1,(kn->field_10).kn_timerfd,(epoll_event *)&local_14);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    kn->kn_registered = 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
evfilt_write_knote_enable(struct filter *filt, struct knote *kn)
{
    if (kn->kn_flags & KNFL_FILE) {
        if (epoll_ctl(kn->kn_epollfd, EPOLL_CTL_ADD, kn->kn_eventfd, EPOLL_EV_KN(kn->epoll_events, kn)) < 0) {
            dbg_perror("epoll_ctl(2)");
            return (-1);
        }
        kn->kn_registered = 1;
        return (0);
    }

    return epoll_update(EPOLL_CTL_ADD, filt, kn, kn->epoll_events, false);
}